

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

string * __thiscall
pbrt::LightBase::BaseToString_abi_cxx11_(string *__return_storage_ptr__,LightBase *this)

{
  Transform *in_R9;
  
  StringPrintf<pbrt::LightType_const&,pbrt::MediumInterface_const&,pbrt::Transform_const&>
            (__return_storage_ptr__,(pbrt *)"type: %s mediumInterface: %s renderFromLight: %s",
             (char *)this,(LightType *)&this->mediumInterface,
             (MediumInterface *)&this->renderFromLight,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string LightBase::BaseToString() const {
    return StringPrintf("type: %s mediumInterface: %s renderFromLight: %s", type,
                        mediumInterface, renderFromLight);
}